

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O2

void (anonymous_namespace)::
     assertEmpty<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v)

{
  size_type sVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  AssertionHandler catchAssertionHandler;
  pointer local_68;
  pointer local_60;
  ITransientExpression local_58;
  pointer *local_48;
  char *local_40;
  size_type local_38;
  pointer *local_30;
  
  local_58._vptr_ITransientExpression = (_func_int **)0x8b33e0;
  local_58.m_isBinaryExpression = true;
  local_58.m_result = false;
  local_58._10_6_ = 0;
  capturedExpression.m_size = 0xe;
  capturedExpression.m_start = "0u == v.size()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_58,capturedExpression,
             ContinueOnFailure);
  local_38 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
  local_58.m_result = local_38 == 0;
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b6ba58;
  local_58._8_8_ = local_58._8_8_ & 0xffffffff;
  local_48 = (pointer *)0x8e95ab;
  local_40 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_58._vptr_ITransientExpression = (_func_int **)0x8b33e0;
  local_58.m_isBinaryExpression = true;
  local_58.m_result = false;
  local_58._10_6_ = 0;
  capturedExpression_00.m_size = 9;
  capturedExpression_00.m_start = "v.empty()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_58,capturedExpression_00,
             ContinueOnFailure);
  local_58._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_58._vptr_ITransientExpression._1_7_,
                (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_58);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_58._vptr_ITransientExpression = (_func_int **)0x8b33e0;
  local_58.m_isBinaryExpression = true;
  local_58.m_result = false;
  local_58._10_6_ = 0;
  capturedExpression_01.m_size = 0x14;
  capturedExpression_01.m_start = "v.begin() == v.end()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_58,capturedExpression_01,
             ContinueOnFailure);
  local_60 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
  local_48 = &local_60;
  sVar1 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
  local_68 = local_60 + sVar1;
  local_58.m_result = sVar1 == 0;
  local_58.m_isBinaryExpression = true;
  local_30 = &local_68;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b678f8;
  local_40 = "==";
  local_38 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void assertEmpty(TVector& v) {
    CHECK(0u == v.size());
    CHECK(v.empty());
    CHECK(v.begin() == v.end());
}